

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16(uint16_t *data,uint32_t len,uint32_t *flags)

{
  uint16_t *in_RDX;
  uint in_ESI;
  uint32_t *in_stack_00000178;
  uint32_t in_stack_00000184;
  uint16_t *in_stack_00000188;
  uint32_t *in_stack_000007c0;
  uint32_t in_stack_000007cc;
  uint16_t *in_stack_000007d0;
  uint32_t *in_stack_00002e30;
  uint32_t in_stack_00002e3c;
  uint16_t *in_stack_00002e40;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (in_ESI < 0x20) {
    local_4 = pospopcnt_u16_sse_sad(in_stack_00000188,in_stack_00000184,in_stack_00000178);
  }
  else if (in_ESI < 0x100) {
    local_4 = pospopcnt_u16_sse_blend_popcnt_unroll8
                        (in_stack_00000188,in_stack_00000184,in_stack_00000178);
  }
  else if (in_ESI < 0x200) {
    local_4 = pospopcnt_u16_avx512bw_blend_popcnt_unroll8
                        (in_stack_000007d0,in_stack_000007cc,in_stack_000007c0);
  }
  else if (in_ESI < 0x1000) {
    local_4 = pospopcnt_u16_avx512bw_adder_forest
                        (in_stack_00002e40,in_stack_00002e3c,in_stack_00002e30);
  }
  else {
    local_4 = pospopcnt_u16_avx512_harvey_seal
                        (in_RDX,in_stack_ffffffffffffffdc,(uint32_t *)0x10f4d1);
  }
  return local_4;
}

Assistant:

int pospopcnt_u16(const uint16_t* data, uint32_t len, uint32_t* flags) {
#if POSPOPCNT_SIMD_VERSION >= 6
    if (len < 32) return(pospopcnt_u16_sse_sad(data, len, flags)); // small
    else if (len < 256)  return(pospopcnt_u16_sse_blend_popcnt_unroll8(data, len, flags)); // small
    else if (len < 512)  return(pospopcnt_u16_avx512bw_blend_popcnt_unroll8(data, len, flags)); // medium
    else if (len < 4096) return(pospopcnt_u16_avx512bw_adder_forest(data, len, flags)); // medium3
    else return(pospopcnt_u16_avx512_harvey_seal(data, len, flags)); // fix
#elif POSPOPCNT_SIMD_VERSION >= 5
    if (len < 128) return(pospopcnt_u16_sse_sad(data, len, flags)); // small
    else if (len < 1024) return(pospopcnt_u16_avx2_blend_popcnt_unroll8(data, len, flags)); // medium
    else return(pospopcnt_u16_avx2_harvey_seal(data, len, flags)); // large
#elif POSPOPCNT_SIMD_VERSION >= 3
    return(pospopcnt_u16_sse_harvey_seal(data, len, flags));
#else
    #ifndef _MSC_VER
        return(pospopcnt_u16_scalar_umul128_unroll2(data, len, flags)); // fallback scalar
    #else
        return(pospopcnt_u16_scalar_naive(data, len, flags));
    #endif
#endif
}